

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setTime(QDateTimeEdit *this,QTime time)

{
  QDateTimeEditPrivate *this_00;
  ulong uVar1;
  undefined8 uVar2;
  QTime in_ESI;
  QAbstractSpinBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  QDateTimeEditPrivate *val;
  QDate in_stack_ffffffffffffffc8;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QDateTimeEdit *)0x5588e9);
  uVar1 = QTime::isValid();
  if ((uVar1 & 1) != 0) {
    (**(code **)(*(long *)&(this_00->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xf8))();
    val = this_00;
    uVar2 = ::QVariant::toDate();
    QDateTimeEditPrivate::dateTimeValue(this_00,in_stack_ffffffffffffffc8,in_ESI);
    ::QVariant::QVariant(&local_28,(QDateTime *)&stack0xffffffffffffffc8);
    QAbstractSpinBoxPrivate::setValue
              (in_RDI,(QVariant *)val,(EmitPolicy)((ulong)uVar2 >> 0x20),
               SUB81((ulong)uVar2 >> 0x18,0));
    ::QVariant::~QVariant(&local_28);
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffc8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setTime(QTime time)
{
    Q_D(QDateTimeEdit);
    if (time.isValid()) {
        d->clearCache();
        d->setValue(d->dateTimeValue(d->value.toDate(), time), EmitIfChanged);
    }
}